

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O3

int tcv_get_sonet_compliance_codes(tcv_t *tcv,tcv_sonet_compliance_codes_t *codes)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -4;
  if ((tcv != (tcv_t *)0x0) && (tcv->created == true)) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&tcv->lock);
    if ((codes != (tcv_sonet_compliance_codes_t *)0x0) && (iVar1 == 0)) {
      iVar2 = -0xd;
      if ((tcv->created == true) && (tcv->initialized == true)) {
        iVar2 = (*tcv->fun->get_sonet_compliance_codes)(tcv,codes);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
    }
  }
  return iVar2;
}

Assistant:

int tcv_get_sonet_compliance_codes(tcv_t *tcv,
                                   tcv_sonet_compliance_codes_t *codes)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv) || !codes)
		return TCV_ERR_INVALID_ARG;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->get_sonet_compliance_codes(tcv, codes);
	}

	tcv_unlock(tcv);
	return ret;
}